

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImageLevel.cpp
# Opt level: O1

void __thiscall Imf_3_2::ImageLevel::resize(ImageLevel *this,Box2i *dataWindow)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  iVar1 = (dataWindow->min).x;
  if ((iVar1 + -1 <= (dataWindow->max).x) &&
     (iVar2 = (dataWindow->min).y, iVar2 + -1 <= (dataWindow->max).y)) {
    (this->_dataWindow).min.x = iVar1;
    (this->_dataWindow).min.y = iVar2;
    (this->_dataWindow).max = dataWindow->max;
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,"Cannot reset data window for image level to (",0x2d);
  poVar3 = (ostream *)std::ostream::operator<<(local_188,(dataWindow->min).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(dataWindow->min).y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") - (",5);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(dataWindow->max).x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(dataWindow->max).y);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"). The new data window is invalid.",0x22);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(this_00,asStack_198);
  __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
ImageLevel::resize (const Box2i& dataWindow)
{
    if (dataWindow.max.x < dataWindow.min.x - 1 ||
        dataWindow.max.y < dataWindow.min.y - 1)
    {
        THROW (
            ArgExc,
            "Cannot reset data window for image level to "
            "(" << dataWindow.min.x
                << ", " << dataWindow.min.y
                << ") - "
                   "("
                << dataWindow.max.x << ", " << dataWindow.max.y
                << "). "
                   "The new data window is invalid.");
    }

    _dataWindow = dataWindow;
}